

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryEntry.h
# Opt level: O0

void __thiscall
JsUtil::
DefaultHashedEntry<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
::Set(DefaultHashedEntry<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      *this,WriteBarrierPtr<void> *key,
     WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
     *value,int hashCode)

{
  int hashCode_local;
  WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
  *value_local;
  WriteBarrierPtr<void> *key_local;
  DefaultHashedEntry<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
  *this_local;
  
  anon_unknown_5::
  KeyValueEntry<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>_>
  ::Set(&this->
         super_KeyValueEntry<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>_>
        ,key,value);
  return;
}

Assistant:

void Set(TKey const& key, TValue const& value, int hashCode)
        {
            __super::Set(key, value);
        }